

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_CountBits(word i)

{
  int iVar1;
  ulong uVar2;
  
  if (i == 0) {
    return 0;
  }
  uVar2 = i - 1 & i;
  if (uVar2 == 0) {
    iVar1 = 1;
  }
  else {
    uVar2 = uVar2 - 1 & uVar2;
    if (uVar2 != 0) {
      uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
      uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
      return (int)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static inline int Str_CountBits( word i )
{
    if ( i == 0 )
        return 0;
    i = (i & (i - 1));
    if ( i == 0 )
        return 1;
    i = (i & (i - 1));
    if ( i == 0 )
        return 2;
    i = i - ((i >> 1) & 0x5555555555555555);
    i = (i & 0x3333333333333333) + ((i >> 2) & 0x3333333333333333);
    i = ((i + (i >> 4)) & 0x0F0F0F0F0F0F0F0F);
    return (i*(0x0101010101010101))>>56;
}